

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O1

bool icu_63::number::impl::blueprint_helpers::parseExponentSignOption
               (StringSegment *segment,MacroProps *macros,UErrorCode *param_3)

{
  char16_t cVar1;
  bool bVar2;
  int32_t sLength;
  UStringTrieResult UVar3;
  uint uVar4;
  UNumberSignDisplay exponentSignDisplay;
  Notation NVar5;
  UCharsTrie tempStemTrie;
  ConstChar16Ptr local_98;
  char16_t *local_90;
  char16_t *local_80;
  UCharsTrie local_78;
  UnicodeString local_58;
  
  local_78.ownedArray_ = (char16_t *)0x0;
  local_78.uchars_ = ::(anonymous_namespace)::kSerializedStemTrie;
  local_78.pos_ = ::(anonymous_namespace)::kSerializedStemTrie;
  local_78.remainingMatchLength_ = -1;
  local_80 = ::(anonymous_namespace)::kSerializedStemTrie;
  numparse::impl::StringSegment::toTempUnicodeString(&local_58,segment);
  if ((local_58.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
    if ((local_58.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
      local_58.fUnion.fFields.fArray = (char16_t *)((long)&local_58.fUnion + 2);
    }
  }
  else {
    local_58.fUnion.fFields.fArray = (char16_t *)0x0;
  }
  local_98.p_ = local_58.fUnion.fFields.fArray;
  sLength = numparse::impl::StringSegment::length(segment);
  UVar3 = UCharsTrie::next(&local_78,&local_98,sLength);
  local_90 = local_98.p_;
  UnicodeString::~UnicodeString(&local_58);
  if (UVar3 + ~USTRINGTRIE_INTERMEDIATE_VALUE < 0xfffffffe) {
    bVar2 = false;
    goto LAB_0026beb2;
  }
  cVar1 = *local_78.pos_;
  if (cVar1 < L'\0') {
    uVar4 = (ushort)cVar1 & 0x7fff;
    if (0x3fff < uVar4) {
      if (uVar4 == 0x7fff) goto LAB_0026be3d;
      uVar4 = uVar4 * 0x10000 + (uint)(ushort)local_78.pos_[1] + 0xc0000000;
    }
  }
  else if ((ushort)cVar1 < 0x4040) {
    uVar4 = ((ushort)cVar1 >> 6) - 1;
  }
  else if ((ushort)cVar1 < 0x7fc0) {
    uVar4 = ((ushort)cVar1 & 0x7fc0) * 0x400 + (uint)(ushort)local_78.pos_[1] + 0xfeff0000;
  }
  else {
LAB_0026be3d:
    uVar4 = CONCAT22(local_78.pos_[1],local_78.pos_[2]);
  }
  bVar2 = true;
  switch(uVar4) {
  case 0x1f:
    exponentSignDisplay = UNUM_SIGN_AUTO;
    break;
  case 0x20:
    exponentSignDisplay = UNUM_SIGN_ALWAYS;
    break;
  case 0x21:
    exponentSignDisplay = UNUM_SIGN_NEVER;
    break;
  case 0x22:
    exponentSignDisplay = UNUM_SIGN_ACCOUNTING;
    break;
  case 0x23:
    exponentSignDisplay = UNUM_SIGN_ACCOUNTING_ALWAYS;
    break;
  case 0x24:
    exponentSignDisplay = UNUM_SIGN_EXCEPT_ZERO;
    break;
  case 0x25:
    exponentSignDisplay = UNUM_SIGN_ACCOUNTING_EXCEPT_ZERO;
    break;
  default:
    exponentSignDisplay = UNUM_SIGN_COUNT;
    bVar2 = false;
  }
  if (bVar2) {
    NVar5 = (Notation)
            ScientificNotation::withExponentSignDisplay
                      ((ScientificNotation *)&macros->notation,exponentSignDisplay);
    macros->notation = NVar5;
    bVar2 = true;
  }
LAB_0026beb2:
  UCharsTrie::~UCharsTrie(&local_78);
  return bVar2;
}

Assistant:

bool
blueprint_helpers::parseExponentSignOption(const StringSegment& segment, MacroProps& macros, UErrorCode&) {
    // Get the sign display type out of the CharsTrie data structure.
    UCharsTrie tempStemTrie(kSerializedStemTrie);
    UStringTrieResult result = tempStemTrie.next(
            segment.toTempUnicodeString().getBuffer(),
            segment.length());
    if (result != USTRINGTRIE_INTERMEDIATE_VALUE && result != USTRINGTRIE_FINAL_VALUE) {
        return false;
    }
    auto sign = stem_to_object::signDisplay(static_cast<StemEnum>(tempStemTrie.getValue()));
    if (sign == UNUM_SIGN_COUNT) {
        return false;
    }
    macros.notation = static_cast<ScientificNotation&>(macros.notation).withExponentSignDisplay(sign);
    return true;
}